

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_pool.hpp
# Opt level: O1

void __thiscall
coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>::client_pool
          (client_pool<cinatra::coro_http_client,_coro_io::io_context_pool> *this,
          client_pools_t *param_2,long param_3,long param_4,uint *param_5,io_context_pool *param_6)

{
  rep rVar1;
  rep rVar2;
  rep rVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  FutureState<async_simple::Unit> *pFVar8;
  
  (this->
  super_enable_shared_from_this<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
  )._M_weak_this.
  super___weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->
  super_enable_shared_from_this<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
  )._M_weak_this.
  super___weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  detail::
  client_queue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>
  ::client_queue(&this->free_clients_,(ulong)*param_5);
  detail::
  client_queue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>
  ::client_queue(&this->short_connect_clients_,0);
  this->pools_manager_ = param_2;
  pFVar8 = (FutureState<async_simple::Unit> *)operator_new(0x58);
  pFVar8->_state = START;
  pFVar8->_attached = (__atomic_base<unsigned_char>)0x0;
  (pFVar8->_continuationRef).super___atomic_base<unsigned_char>._M_i = '\0';
  *(__index_type *)
   ((long)&(pFVar8->_try_value)._value.
           super__Variant_base<std::monostate,_async_simple::Unit,_std::__exception_ptr::exception_ptr>
           .
           super__Move_assign_alias<std::monostate,_async_simple::Unit,_std::__exception_ptr::exception_ptr>
           .
           super__Copy_assign_alias<std::monostate,_async_simple::Unit,_std::__exception_ptr::exception_ptr>
           .
           super__Move_ctor_alias<std::monostate,_async_simple::Unit,_std::__exception_ptr::exception_ptr>
   + 8) = '\0';
  pFVar8->_executor = (Executor *)0x0;
  pFVar8->_context = (Context)0x0;
  *(undefined8 *)((long)&pFVar8->_context + 1) = 0;
  *(undefined8 *)((long)&(pFVar8->_promiseRef).super___atomic_base<unsigned_long>._M_i + 1) = 0;
  (this->idle_timeout_waiter)._sharedState = pFVar8;
  (this->idle_timeout_waiter)._hasFuture = false;
  LOCK();
  (pFVar8->_promiseRef).super___atomic_base<unsigned_long>._M_i =
       (pFVar8->_promiseRef).super___atomic_base<unsigned_long>._M_i + 1;
  UNLOCK();
  LOCK();
  (pFVar8->_attached).super___atomic_base<unsigned_char>._M_i =
       (pFVar8->_attached).super___atomic_base<unsigned_char>._M_i + '\x01';
  UNLOCK();
  (this->host_name_)._M_dataplus._M_p = (pointer)&(this->host_name_).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->host_name_,param_4,param_3 + param_4);
  uVar4 = param_5[0];
  uVar5 = param_5[1];
  uVar6 = param_5[2];
  uVar7 = param_5[3];
  rVar1 = *(rep *)(param_5 + 4);
  rVar2 = *(rep *)(param_5 + 6);
  rVar3 = *(rep *)(param_5 + 10);
  (this->pool_config_).short_connect_idle_timeout.__r = *(rep *)(param_5 + 8);
  (this->pool_config_).host_alive_detect_duration.__r = rVar3;
  (this->pool_config_).reconnect_wait_time.__r = rVar1;
  (this->pool_config_).idle_timeout.__r = rVar2;
  (this->pool_config_).max_connection = uVar4;
  (this->pool_config_).connect_retry_count = uVar5;
  (this->pool_config_).idle_queue_per_max_clear_count = uVar6;
  *(uint *)&(this->pool_config_).field_0xc = uVar7;
  cinatra::coro_http_client::config::config
            (&(this->pool_config_).client_config,(config *)(param_5 + 0xc));
  this->io_context_pool_ = param_6;
  (this->is_alive_)._M_base._M_i = true;
  return;
}

Assistant:

client_pool(private_construct_token t, client_pools_t* pools_manager_,
              std::string_view host_name, const pool_config& pool_config,
              io_context_pool_t& io_context_pool)
      : pools_manager_(pools_manager_),
        host_name_(host_name),
        pool_config_(pool_config),
        io_context_pool_(io_context_pool),
        free_clients_(pool_config.max_connection){}